

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_replace(lua_State *L,int idx)

{
  TValue *pTVar1;
  GCobj *v;
  GCobj *o;
  
  if (idx == -0x2711) {
    o = (GCobj *)(ulong)L->base[-1].u32.lo;
    if ((o->gch).gct != '\b') {
      lj_err_msg(L,LJ_ERR_NOENV);
    }
    (o->gch).env.gcptr32 = (uint32_t)L->top[-1].field_2.field_0;
    if ((8 < *(int *)((long)L->top + -4) + 0xdU) ||
       (v = (GCobj *)(ulong)L->top[-1].u32.lo, ((v->gch).marked & 3) == 0)) goto LAB_0010de39;
  }
  else {
    if (idx == -0x2712) {
      (L->env).gcptr32 = (uint32_t)L->top[-1].field_2.field_0;
      goto LAB_0010de39;
    }
    pTVar1 = index2adr(L,idx);
    *pTVar1 = L->top[-1];
    if (((-0x2713 < idx) || (8 < *(int *)((long)L->top + -4) + 0xdU)) ||
       (v = (GCobj *)(ulong)L->top[-1].u32.lo, ((v->gch).marked & 3) == 0)) goto LAB_0010de39;
    o = (GCobj *)(ulong)L->base[-1].u32.lo;
  }
  if (((o->gch).marked & 4) != 0) {
    lj_gc_barrierf((global_State *)(ulong)(L->glref).ptr32,o,v);
  }
LAB_0010de39:
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_replace(lua_State *L, int idx)
{
  api_checknelems(L, 1);
  if (idx == LUA_GLOBALSINDEX) {
    api_check(L, tvistab(L->top-1));
    /* NOBARRIER: A thread (i.e. L) is never black. */
    setgcref(L->env, obj2gco(tabV(L->top-1)));
  } else if (idx == LUA_ENVIRONINDEX) {
    GCfunc *fn = curr_func(L);
    if (fn->c.gct != ~LJ_TFUNC)
      lj_err_msg(L, LJ_ERR_NOENV);
    api_check(L, tvistab(L->top-1));
    setgcref(fn->c.env, obj2gco(tabV(L->top-1)));
    lj_gc_barrier(L, fn, L->top-1);
  } else {
    TValue *o = index2adr(L, idx);
    api_checkvalidindex(L, o);
    copyTV(L, o, L->top-1);
    if (idx < LUA_GLOBALSINDEX)  /* Need a barrier for upvalues. */
      lj_gc_barrier(L, curr_func(L), L->top-1);
  }
  L->top--;
}